

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O2

void TR_Stmt(ast *node)

{
  int iVar1;
  ast *paVar2;
  undefined1 local_220 [152];
  Operand label2;
  Operand label1;
  Operand label3;
  Operand t1;
  InterCode local_c8;
  
  paVar2 = child(node,1);
  label1.kind = 0;
  label1.value._M_dataplus._M_p = (pointer)&label1.value.field_2;
  label1.value._M_string_length = 0;
  label1.value.field_2._M_local_buf[0] = '\0';
  label1.active = -1;
  label2.kind = 0;
  label2.value._M_dataplus._M_p = (pointer)&label2.value.field_2;
  label2.value._M_string_length = 0;
  label2.value.field_2._M_local_buf[0] = '\0';
  label2.active = -1;
  label3.kind = 0;
  label3.value._M_dataplus._M_p = (pointer)&label3.value.field_2;
  label3.value._M_string_length = 0;
  label3.value.field_2._M_local_buf[0] = '\0';
  label3.active = -1;
  t1.kind = 0;
  t1.value._M_dataplus._M_p = (pointer)&t1.value.field_2;
  t1.value._M_string_length = 0;
  t1.value.field_2._M_local_buf[0] = '\0';
  t1.active = -1;
  iVar1 = paVar2->type;
  if (iVar1 == -0x2704) {
    TR_CompSt(paVar2);
  }
  else {
    if (iVar1 == 0x11b) {
      IrSim::newLabel((Operand *)local_220,&irSim);
      Operand::operator=(&label1,(Operand *)local_220);
      std::__cxx11::string::~string((string *)(local_220 + 8));
      IrSim::newLabel((Operand *)local_220,&irSim);
      Operand::operator=(&label2,(Operand *)local_220);
      std::__cxx11::string::~string((string *)(local_220 + 8));
      IrSim::newLabel((Operand *)local_220,&irSim);
      Operand::operator=(&label3,(Operand *)local_220);
      std::__cxx11::string::~string((string *)(local_220 + 8));
      IrSim::icLabel((InterCode *)local_220,&irSim,&label1);
      IrSim::commitIc(&irSim,(C_IC *)local_220);
      InterCode::~InterCode((InterCode *)local_220);
      paVar2 = child(node,3);
      TR_Cond(paVar2,&label2,&label3);
      IrSim::icLabel((InterCode *)local_220,&irSim,&label2);
      IrSim::commitIc(&irSim,(C_IC *)local_220);
      InterCode::~InterCode((InterCode *)local_220);
      paVar2 = child(node,5);
      TR_Stmt(paVar2);
      IrSim::icGoto((InterCode *)local_220,&irSim,&label1);
      IrSim::commitIc(&irSim,(C_IC *)local_220);
      IrSim::icLabel(&local_c8,&irSim,&label3);
      IrSim::commitIc(&irSim,&local_c8);
      InterCode::~InterCode(&local_c8);
    }
    else if (iVar1 == 0x118) {
      IrSim::newTmpVar((Operand *)local_220,&irSim);
      Operand::operator=(&t1,(Operand *)local_220);
      std::__cxx11::string::~string((string *)(local_220 + 8));
      paVar2 = child(node,2);
      TR_Exp(paVar2,&t1);
      IrSim::icReturn((InterCode *)local_220,&irSim,&t1);
      IrSim::commitIc(&irSim,(C_IC *)local_220);
    }
    else {
      if (iVar1 != 0x119) {
        if (iVar1 != -0x26fd) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/src/ir.cpp"
                        ,0x2b3,"void TR_Stmt(ast *)");
        }
        TR_Exp(paVar2,&OP_NONE);
        goto LAB_0010b6d7;
      }
      IrSim::newLabel((Operand *)local_220,&irSim);
      Operand::operator=(&label1,(Operand *)local_220);
      std::__cxx11::string::~string((string *)(local_220 + 8));
      IrSim::newLabel((Operand *)local_220,&irSim);
      Operand::operator=(&label2,(Operand *)local_220);
      std::__cxx11::string::~string((string *)(local_220 + 8));
      paVar2 = child(node,3);
      TR_Cond(paVar2,&label1,&label2);
      IrSim::icLabel((InterCode *)local_220,&irSim,&label1);
      IrSim::commitIc(&irSim,(C_IC *)local_220);
      InterCode::~InterCode((InterCode *)local_220);
      paVar2 = child(node,5);
      TR_Stmt(paVar2);
      paVar2 = child(node,7);
      if (paVar2 == (ast *)0x0) {
        IrSim::icLabel((InterCode *)local_220,&irSim,&label2);
        IrSim::commitIc(&irSim,(C_IC *)local_220);
      }
      else {
        IrSim::newLabel((Operand *)local_220,&irSim);
        Operand::operator=(&label3,(Operand *)local_220);
        std::__cxx11::string::~string((string *)(local_220 + 8));
        IrSim::icGoto((InterCode *)local_220,&irSim,&label3);
        IrSim::commitIc(&irSim,(C_IC *)local_220);
        IrSim::icLabel(&local_c8,&irSim,&label2);
        IrSim::commitIc(&irSim,&local_c8);
        InterCode::~InterCode(&local_c8);
        InterCode::~InterCode((InterCode *)local_220);
        TR_Stmt(paVar2);
        IrSim::icLabel((InterCode *)local_220,&irSim,&label3);
        IrSim::commitIc(&irSim,(C_IC *)local_220);
      }
    }
    InterCode::~InterCode((InterCode *)local_220);
  }
LAB_0010b6d7:
  std::__cxx11::string::~string((string *)&t1.value);
  std::__cxx11::string::~string((string *)&label3.value);
  std::__cxx11::string::~string((string *)&label2.value);
  std::__cxx11::string::~string((string *)&label1.value);
  return;
}

Assistant:

static void TR_Stmt(ast *node) {
    ast *c1 = child(node, 1), *c7;
    Operand label1, label2, label3, t1;
    switch (c1->type) {
        case Exp:    TR_Exp(c1, OP_NONE); break;
        case CompSt: TR_CompSt(c1);       break;
        case RETURN:
            t1 = irSim.newTmpVar();
            TR_Exp(child(node, 2), t1);
            irSim << irSim.icReturn(t1);
            break;
        case IF:
            label1 = irSim.newLabel();
            label2 = irSim.newLabel();
            TR_Cond(child(node, 3), label1, label2);
            irSim << irSim.icLabel(label1);
            TR_Stmt(child(node, 5));
            if (!(c7 = child(node, 7))) { // without ELSE node
                irSim << irSim.icLabel(label2);
                return;
            }
            label3 = irSim.newLabel();
            irSim << irSim.icGoto(label3) << irSim.icLabel(label2);
            TR_Stmt(c7);
            irSim << irSim.icLabel(label3);
            break;
        case WHILE:
            label1 = irSim.newLabel();
            label2 = irSim.newLabel();
            label3 = irSim.newLabel();
            irSim << irSim.icLabel(label1);
            TR_Cond(child(node, 3), label2, label3);
            irSim << irSim.icLabel(label2);
            TR_Stmt(child(node, 5));
            irSim << irSim.icGoto(label1) << irSim.icLabel(label3);
            break;
        default: assert(false); break;
    }
}